

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_order.c
# Opt level: O3

longlong amd_l_order(longlong n,longlong *Ap,longlong *Ai,longlong *P,c_float *Control,c_float *Info
                    )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  longlong *W;
  longlong *Flag;
  size_t sVar4;
  ulong uVar5;
  longlong *S;
  c_float cVar6;
  ulong uVar7;
  ulong nitems;
  longlong lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  longlong *local_68;
  longlong *local_60;
  double local_40;
  
  if (Info != (c_float *)0x0) {
    lVar3 = 0;
    do {
      Info[lVar3] = -1.0;
      (Info + lVar3)[1] = -1.0;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x14);
    Info[1] = (double)n;
    *Info = 0.0;
  }
  if ((((n < 0) || (Ap == (longlong *)0x0)) || (Ai == (longlong *)0x0)) || (P == (longlong *)0x0)) {
    lVar8 = -2;
    if (Info == (c_float *)0x0) {
      return -2;
    }
    cVar6 = -2.0;
    goto LAB_0010bf51;
  }
  if (n == 0) {
    return 0;
  }
  sVar4 = Ap[n];
  if (Info == (c_float *)0x0) {
    if ((long)sVar4 < 0) {
      return -2;
    }
    if (0x1ffffffffffffffe < sVar4 || 0x1ffffffffffffffe < (ulong)n) {
      return -1;
    }
    lVar3 = amd_l_valid(n,n,Ap,Ai);
    if (lVar3 == -2) {
      return -2;
    }
  }
  else {
    Info[2] = (double)(long)sVar4;
    if ((long)sVar4 < 0) {
LAB_0010bfdd:
      *Info = -2.0;
      return -2;
    }
    if (0x1ffffffffffffffe < sVar4 || 0x1ffffffffffffffe < (ulong)n) {
      *Info = -1.0;
      return -1;
    }
    lVar3 = amd_l_valid(n,n,Ap,Ai);
    if (lVar3 == -2) goto LAB_0010bfdd;
  }
  W = (longlong *)SuiteSparse_malloc(n,8);
  Flag = (longlong *)SuiteSparse_malloc(n,8);
  if (W == (longlong *)0x0 || Flag == (longlong *)0x0) {
    SuiteSparse_free(W);
  }
  else {
    local_40 = (double)n + (double)n;
    if (lVar3 == 1) {
      local_60 = (longlong *)SuiteSparse_malloc(n + 1U,8);
      local_68 = (longlong *)SuiteSparse_malloc(sVar4,8);
      if (local_60 != (longlong *)0x0 && local_68 != (longlong *)0x0) {
        local_40 = local_40 + (double)(long)(n + 1U) + (double)(long)(sVar4 + (sVar4 == 0));
        amd_l_preprocess(n,Ap,Ai,local_60,local_68,W,Flag);
        Ai = local_68;
        Ap = local_60;
        goto LAB_0010c126;
      }
      SuiteSparse_free(local_60);
    }
    else {
      local_60 = (longlong *)0x0;
      local_68 = (longlong *)0x0;
LAB_0010c126:
      sVar4 = amd_l_aat(n,Ap,Ai,W,P,Info);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar4;
      auVar2._8_8_ = 4;
      auVar2._0_8_ = 0xcccccccccccccccd;
      if (!CARRY8(sVar4 / 5,sVar4)) {
        uVar5 = 0;
        nitems = SUB168(auVar1 * auVar2,8) >> 2;
        do {
          uVar7 = nitems;
          nitems = uVar7 + n;
          if (nitems <= uVar7) break;
          bVar9 = uVar5 < 6;
          uVar5 = uVar5 + 1;
        } while (bVar9);
        if ((nitems < 0x1fffffffffffffff && uVar7 < nitems) &&
           (S = (longlong *)SuiteSparse_malloc(nitems,8), S != (longlong *)0x0)) {
          if (Info != (c_float *)0x0) {
            auVar10._8_4_ = (int)(nitems >> 0x20);
            auVar10._0_8_ = nitems;
            auVar10._12_4_ = 0x45300000;
            Info[7] = (local_40 +
                      (auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)nitems) - 4503599627370496.0)) * 8.0;
            amd_l1(n,Ap,Ai,P,Flag,W,nitems,S,Control,Info);
            SuiteSparse_free(local_60);
            SuiteSparse_free(local_68);
            SuiteSparse_free(W);
            SuiteSparse_free(Flag);
            SuiteSparse_free(S);
            *Info = (double)lVar3;
            return lVar3;
          }
          amd_l1(n,Ap,Ai,P,Flag,W,nitems,S,Control,(c_float *)0x0);
          SuiteSparse_free(local_60);
          SuiteSparse_free(local_68);
          SuiteSparse_free(W);
          SuiteSparse_free(Flag);
          SuiteSparse_free(S);
          return lVar3;
        }
      }
      SuiteSparse_free(local_60);
    }
    SuiteSparse_free(local_68);
    SuiteSparse_free(W);
  }
  SuiteSparse_free(Flag);
  lVar8 = -1;
  if (Info == (c_float *)0x0) {
    return -1;
  }
  cVar6 = -1.0;
LAB_0010bf51:
  *Info = cVar6;
  return lVar8;
}

Assistant:

GLOBAL Int AMD_order
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int P [ ],
    c_float Control [ ],
    c_float Info [ ]
)
{
    Int *Len, *S, nz, i, *Pinv, info, status, *Rp, *Ri, *Cp, *Ci, ok ;
    size_t nzaat, slen ;
    c_float mem = 0 ;

#ifndef NDEBUG
    AMD_debug_init ("amd") ;
#endif

    /* clear the Info array, if it exists */
    info = Info != (c_float *) NULL ;
    if (info)
    {
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_N] = n ;
	Info [AMD_STATUS] = AMD_OK ;
    }

    /* make sure inputs exist and n is >= 0 */
    if (Ai == (Int *) NULL || Ap == (Int *) NULL || P == (Int *) NULL || n < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* arguments are invalid */
    }

    if (n == 0)
    {
	return (AMD_OK) ;	    /* n is 0 so there's nothing to do */
    }

    nz = Ap [n] ;
    if (info)
    {
	Info [AMD_NZ] = nz ;
    }
    if (nz < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;
    }

    /* check if n or nz will cause size_t overflow */
    if (((size_t) n) >= SIZE_T_MAX / sizeof (Int)
     || ((size_t) nz) >= SIZE_T_MAX / sizeof (Int))
    {
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;	    /* problem too large */
    }

    /* check the input matrix:	AMD_OK, AMD_INVALID, or AMD_OK_BUT_JUMBLED */
    status = AMD_valid (n, n, Ap, Ai) ;

    if (status == AMD_INVALID)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* matrix is invalid */
    }

    /* allocate two size-n integer workspaces */
    Len  = SuiteSparse_malloc (n, sizeof (Int)) ;
    Pinv = SuiteSparse_malloc (n, sizeof (Int)) ;
    mem += n ;
    mem += n ;
    if (!Len || !Pinv)
    {
	/* :: out of memory :: */
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }

    if (status == AMD_OK_BUT_JUMBLED)
    {
	/* sort the input matrix and remove duplicate entries */
	AMD_DEBUG1 (("Matrix is jumbled\n")) ;
	Rp = SuiteSparse_malloc (n+1, sizeof (Int)) ;
	Ri = SuiteSparse_malloc (nz,  sizeof (Int)) ;
	mem += (n+1) ;
	mem += MAX (nz,1) ;
	if (!Rp || !Ri)
	{
	    /* :: out of memory :: */
	    SuiteSparse_free (Rp) ;
	    SuiteSparse_free (Ri) ;
	    SuiteSparse_free (Len) ;
	    SuiteSparse_free (Pinv) ;
	    if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	    return (AMD_OUT_OF_MEMORY) ;
	}
	/* use Len and Pinv as workspace to create R = A' */
	AMD_preprocess (n, Ap, Ai, Rp, Ri, Len, Pinv) ;
	Cp = Rp ;
	Ci = Ri ;
    }
    else
    {
	/* order the input matrix as-is.  No need to compute R = A' first */
	Rp = NULL ;
	Ri = NULL ;
	Cp = (Int *) Ap ;
	Ci = (Int *) Ai ;
    }

    /* --------------------------------------------------------------------- */
    /* determine the symmetry and count off-diagonal nonzeros in A+A' */
    /* --------------------------------------------------------------------- */

    nzaat = AMD_aat (n, Cp, Ci, Len, P, Info) ;
    AMD_DEBUG1 (("nzaat: %g\n", (c_float) nzaat)) ;
    ASSERT ((MAX (nz-n, 0) <= nzaat) && (nzaat <= 2 * (size_t) nz)) ;

    /* --------------------------------------------------------------------- */
    /* allocate workspace for matrix, elbow room, and 6 size-n vectors */
    /* --------------------------------------------------------------------- */

    S = NULL ;
    slen = nzaat ;			/* space for matrix */
    ok = ((slen + nzaat/5) >= slen) ;	/* check for size_t overflow */
    slen += nzaat/5 ;			/* add elbow room */
    for (i = 0 ; ok && i < 7 ; i++)
    {
	ok = ((slen + n) > slen) ;	/* check for size_t overflow */
	slen += n ;			/* size-n elbow room, 6 size-n work */
    }
    mem += slen ;
    ok = ok && (slen < SIZE_T_MAX / sizeof (Int)) ; /* check for overflow */
    ok = ok && (slen < Int_MAX) ;	/* S[i] for Int i must be OK */
    if (ok)
    {
	S = SuiteSparse_malloc (slen, sizeof (Int)) ;
    }
    AMD_DEBUG1 (("slen %g\n", (c_float) slen)) ;
    if (!S)
    {
	/* :: out of memory :: (or problem too large) */
	SuiteSparse_free (Rp) ;
	SuiteSparse_free (Ri) ;
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }
    if (info)
    {
	/* memory usage, in bytes. */
	Info [AMD_MEMORY] = mem * sizeof (Int) ;
    }

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_1 (n, Cp, Ci, P, Pinv, Len, slen, S, Control, Info) ;

    /* --------------------------------------------------------------------- */
    /* free the workspace */
    /* --------------------------------------------------------------------- */

    SuiteSparse_free (Rp) ;
    SuiteSparse_free (Ri) ;
    SuiteSparse_free (Len) ;
    SuiteSparse_free (Pinv) ;
    SuiteSparse_free (S) ;
    if (info) Info [AMD_STATUS] = status ;
    return (status) ;	    /* successful ordering */
}